

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

uint64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getFirstTag(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  bool bVar1;
  uint8_t *puVar2;
  unsigned_long local_28;
  unsigned_long local_20;
  unsigned_long local_18;
  
  bVar1 = isTagged((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11d798);
  if (bVar1) {
    puVar2 = ptr((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11d7af);
    if (*puVar2 == 0xee) {
      puVar2 = ptr((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11d7c3);
      local_20 = readIntegerFixed<unsigned_long,1ul>(puVar2 + 1);
    }
    else {
      puVar2 = ptr((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11d7e0);
      if (*puVar2 == 0xef) {
        puVar2 = ptr((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11d7f4
                    );
        local_28 = readIntegerFixed<unsigned_long,8ul>(puVar2 + 1);
      }
      else {
        local_28 = 0;
      }
      local_20 = local_28;
    }
    local_18 = local_20;
  }
  else {
    local_18 = 0;
  }
  return local_18;
}

Assistant:

constexpr uint64_t getFirstTag() const {
    // always need the actual first byte, so use ptr() directly
    return !isTagged() ? 0
                       : (*ptr() == 0xee
                              ? readIntegerFixed<uint64_t, 1>(ptr() + 1)
                              : (*ptr() == 0xef
                                     ? readIntegerFixed<uint64_t, 8>(ptr() + 1)
                                     : /* error */ 0));
  }